

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

bool __thiscall
HighsSymmetryDetection::isFullOrbitope
          (HighsSymmetryDetection *this,ComponentData *componentData,HighsInt component,
          HighsSymmetries *symmetries)

{
  HighsHashTable<int,_int> *this_00;
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer piVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  undefined7 extraout_var;
  pointer piVar13;
  undefined7 uVar14;
  int iVar15;
  size_type sVar16;
  uint uVar17;
  pointer piVar18;
  int iVar19;
  int *args;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  u8 meta;
  u64 startPos;
  u64 pos;
  HighsHashTable<int,_void> colSet;
  HighsOrbitopeMatrix orbitopeMatrix;
  u64 maxPos;
  int *local_120;
  u8 local_111;
  pointer local_110;
  HighsSymmetries *local_108;
  int *local_100;
  size_type local_f8;
  long local_f0;
  long local_e8;
  u64 local_e0;
  u64 local_d8;
  HighsHashTable<int,_void> local_d0;
  int *local_a8;
  HighsOrbitopeMatrix local_a0;
  u64 local_38;
  ulong uVar12;
  
  lVar22 = (long)component;
  piVar13 = (componentData->componentStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar15 = piVar13[lVar22 + 1];
  iVar3 = piVar13[lVar22];
  local_f8 = (long)iVar15 - (long)iVar3;
  iVar21 = (int)local_f8;
  if (iVar21 != 1) {
    if (iVar3 < iVar15) {
      pHVar5 = this->model;
      lVar20 = 0;
      do {
        iVar15 = (componentData->componentSets).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar3 + lVar20];
        if ((pHVar5->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar15] == kContinuous) {
          return false;
        }
        dVar2 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15];
        if (dVar2 != 0.0) {
          return false;
        }
        if (NAN(dVar2)) {
          return false;
        }
        dVar2 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15];
        if (dVar2 != 1.0) {
          return false;
        }
        if (NAN(dVar2)) {
          return false;
        }
        lVar20 = lVar20 + 1;
      } while (iVar21 != (int)lVar20);
    }
    piVar13 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar18 = (componentData->permComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar15 = piVar13[lVar22];
    lVar20 = (long)iVar15;
    iVar3 = piVar18[lVar20];
    piVar6 = (componentData->numUnfixed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = piVar6[iVar3];
    if ((uVar17 & 1) == 0) {
      local_e8 = lVar22 + 1;
      iVar4 = piVar13[local_e8];
      do {
        lVar20 = lVar20 + 1;
        if (iVar4 <= lVar20) {
          iVar19 = (int)uVar17 >> 1;
          iVar10 = (int)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | local_f8 & 0xffffffff) /
                        (long)iVar19);
          if (iVar10 * iVar19 != iVar21) {
            return false;
          }
          if (iVar4 - iVar15 != iVar10 + -1) {
            return false;
          }
          local_108 = symmetries;
          HighsHashTable<int,_int>::HighsHashTable(&local_a0.columnToRow);
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (int *)0x0;
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (int *)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d0.entries._M_t.
          super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
          .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ =
               0xffffffff;
          std::vector<int,_std::allocator<int>_>::resize
                    (&local_a0.matrix,local_f8,(value_type_conflict2 *)&local_d0);
          iVar15 = this->numActiveCols;
          piVar13 = (local_108->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_a0.rowLength = iVar10;
          local_a0.numRows = iVar19;
          HighsHashTable<int,_void>::HighsHashTable(&local_d0);
          if (this->numActiveCols < 1) goto LAB_00301cf5;
          lVar20 = 0;
          lVar23 = 0;
          iVar21 = 0;
          local_110 = piVar13 + iVar3 * iVar15;
          goto LAB_00301c2f;
        }
      } while (piVar6[piVar18[lVar20]] == uVar17);
    }
  }
  return false;
  while( true ) {
    lVar23 = lVar23 + 1;
    lVar20 = lVar20 + 4;
    if (this->numActiveCols <= lVar23) break;
LAB_00301c2f:
    lVar11 = (long)(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[*(int *)((long)local_110 + lVar20)];
    cVar8 = '\n';
    if ((lVar23 < lVar11) && (cVar8 = '\x01', iVar21 != iVar19)) {
      piVar13 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar15 = *(int *)((long)piVar13 + lVar20);
      if (local_110[lVar11] == iVar15) {
        local_100 = (int *)((long)local_110 + lVar20);
        local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar21] = iVar15;
        local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)local_a0.numRows + (long)iVar21] = *local_100;
        bVar7 = HighsHashTable<int,void>::insert<int&>
                          ((HighsHashTable<int,void> *)&local_d0,(int *)((long)piVar13 + lVar20));
        if (bVar7) {
          bVar7 = HighsHashTable<int,void>::insert<int_const&>
                            ((HighsHashTable<int,void> *)&local_d0,local_100);
          iVar21 = iVar21 + (uint)bVar7;
          cVar8 = !bVar7;
        }
      }
    }
    if ((cVar8 != '\n') && (cVar8 != '\0')) goto LAB_00301ff5;
  }
LAB_00301cf5:
  iVar15 = 2;
  local_110 = (pointer)0x0;
  local_f0 = lVar22;
  do {
    piVar13 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_a0.rowLength <= iVar15) {
      if (local_d0.numElements == local_f8) {
        if (local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          this_00 = &local_108->columnToOrbitope;
          piVar18 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            local_e0._0_4_ = *piVar18;
            local_d8 = ((long)(local_108->orbitopes).
                              super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_108->orbitopes).
                              super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
            HighsHashTable<int,int>::insert<int&,unsigned_long>
                      ((HighsHashTable<int,int> *)this_00,(int *)&local_e0,&local_d8);
            piVar18 = piVar18 + 1;
          } while (piVar18 != piVar13);
        }
        bVar7 = true;
        std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::
        emplace_back<HighsOrbitopeMatrix>(&local_108->orbitopes,&local_a0);
        goto LAB_00301ff7;
      }
      break;
    }
    sVar16 = (long)iVar15 * (long)local_a0.numRows;
    if (local_d0.numElements != sVar16) break;
    local_a8 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sVar16;
    local_120 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)local_a0.numRows * (long)(iVar15 + -1);
    bVar7 = false;
    do {
      piVar13 = (componentData->permComponentStarts).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (piVar13[lVar22] + 1 < piVar13[local_e8]) {
        iVar3 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*local_120];
        lVar22 = (long)piVar13[lVar22] + 1;
        do {
          piVar18 = (local_108->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    (long)this->numActiveCols *
                    (long)(componentData->permComponents).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar22];
          uVar12 = (ulong)(uint)piVar18[iVar3];
          if (piVar18[iVar3] ==
              (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3]) {
LAB_00301dfd:
            piVar13 = (pointer)CONCAT71((int7)(uVar12 >> 8),1);
          }
          else {
            bVar9 = HighsHashTable<int,_void>::findPosition
                              (&local_d0,piVar18 + iVar3,&local_111,&local_e0,&local_38,&local_d8);
            uVar12 = CONCAT71(extraout_var,bVar9);
            if (bVar9 && CONCAT44(local_d0.entries._M_t.
                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                  .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                  _M_head_impl._4_4_,
                                  local_d0.entries._M_t.
                                  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                  .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                  _M_head_impl._0_4_) != 0) goto LAB_00301dfd;
            bVar7 = true;
            piVar13 = (pointer)0x0;
          }
          if ((char)piVar13 == '\0') break;
          lVar22 = lVar22 + 1;
          piVar13 = (pointer)(long)(componentData->permComponentStarts).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_e8];
        } while (lVar22 < (long)piVar13);
      }
      else {
        piVar18 = (pointer)0x0;
      }
      lVar22 = local_f0;
      if (bVar7) {
        bVar9 = false;
        uVar14 = 0;
      }
      else if (((ulong)local_110 & 1) == 0) {
        local_110 = (pointer)CONCAT71((int7)((ulong)piVar13 >> 8),1);
        local_120 = local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        uVar14 = (undefined7)
                 ((ulong)local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 8);
        bVar9 = true;
      }
      else {
        bVar9 = false;
        uVar14 = 0;
      }
    } while (bVar9);
    if (bVar7) {
      local_100 = (int *)CONCAT44(local_100._4_4_,(int)CONCAT71(uVar14,local_a0.numRows < 1));
      if ((0 < local_a0.numRows) &&
         (piVar13 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start, iVar3 = piVar18[piVar13[*local_120]],
         *local_a8 = iVar3, piVar18[piVar13[iVar3]] == *local_120)) {
        lVar20 = 1;
        args = local_a8;
        do {
          bVar7 = HighsHashTable<int,void>::insert<int&>((HighsHashTable<int,void> *)&local_d0,args)
          ;
          if (!bVar7) break;
          local_100 = (int *)CONCAT44(local_100._4_4_,
                                      (int)CONCAT71((int7)(int3)((uint)local_a0.numRows >> 8),
                                                    local_a0.numRows <= lVar20));
          if (local_a0.numRows <= lVar20) break;
          piVar13 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar3 = piVar18[piVar13[local_120[lVar20]]];
          args[1] = iVar3;
          args = args + 1;
          piVar1 = local_120 + lVar20;
          lVar20 = lVar20 + 1;
        } while (piVar18[piVar13[iVar3]] == *piVar1);
      }
      iVar15 = iVar15 + ((uint)local_100 & 1);
      uVar17 = (uint)local_100;
    }
    else {
      uVar17 = 0;
    }
  } while ((uVar17 & 1) != 0);
LAB_00301ff5:
  bVar7 = false;
LAB_00301ff7:
  HighsHashTable<int,_void>::~HighsHashTable(&local_d0);
  if (local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a0.matrix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.rowIsSetPacking.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.rowIsSetPacking.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsHashTable<int,_int>::~HighsHashTable(&local_a0.columnToRow);
  return bVar7;
}

Assistant:

bool HighsSymmetryDetection::isFullOrbitope(const ComponentData& componentData,
                                            HighsInt component,
                                            HighsSymmetries& symmetries) {
  HighsInt componentSize = componentData.componentStarts[component + 1] -
                           componentData.componentStarts[component];
  if (componentSize == 1) return false;

  // check that component acts only on binary variables
  for (HighsInt i = componentData.componentStarts[component];
       i < componentData.componentStarts[component + 1]; ++i) {
    HighsInt col = componentData.componentSets[i];
    if (model->integrality_[col] == HighsVarType::kContinuous ||
        model->col_lower_[col] != 0.0 || model->col_upper_[col] != 1.0)
      return false;
  }

  // check that the number of unfixed variables in the first permutation is even
  HighsInt p0 =
      componentData
          .permComponents[componentData.permComponentStarts[component]];
  if (componentData.numUnfixed[p0] & 1) return false;

  // check that the other permutations in the component have the same number of
  // unfixed variables as the first one
  for (HighsInt k = componentData.permComponentStarts[component] + 1;
       k < componentData.permComponentStarts[component + 1]; ++k) {
    HighsInt p = componentData.permComponents[k];
    if (componentData.numUnfixed[p] != componentData.numUnfixed[p0]) {
      // printf("number of unfixed cols in perm %d: %d\n", p,
      //       componentData.numUnfixed[p]);
      // printf("wrong number of unfixed columns in permutation\n");
      return false;
    }
  }

  // all unfixed variables in the permutation must be part of a two cycle
  // and each two cycle defines one row of the orbitope. Hence the number
  // of unfixed variables in each permutation must be even and the number of
  // rows is the number of unfixed variables divided by two
  HighsInt orbitopeNumRows = componentData.numUnfixed[p0] >> 1;

  // if this component is a full orbitope the component size must be
  // divisible by the number of orbits and the result is the size of each
  // orbit
  HighsInt orbitopeOrbitSize = componentSize / orbitopeNumRows;
  if (orbitopeOrbitSize * orbitopeNumRows != componentSize) {
    // printf("wrong number of orbits (%d orbits for component of size %d)\n",
    //        orbitopeNumRows, componentSize);
    return false;
  }

  // the number of permutations must be n-1 where n is the size of the
  // orbits in the orbitope
  HighsInt componentNumPerms =
      componentData.permComponentStarts[component + 1] -
      componentData.permComponentStarts[component];
  if (componentNumPerms != (orbitopeOrbitSize - 1)) {
    // printf("wrong number of perms\n");
    return false;
  }

  // set up the first two columns of the orbitope matrix based on the first
  // permutation.
  HighsOrbitopeMatrix orbitopeMatrix;
  orbitopeMatrix.matrix.resize(componentSize, -1);
  orbitopeMatrix.numRows = orbitopeNumRows;
  orbitopeMatrix.rowLength = orbitopeOrbitSize;
  assert(componentSize == orbitopeMatrix.numRows * orbitopeMatrix.rowLength);

  const HighsInt* perm = symmetries.permutations.data() + p0 * numActiveCols;
  HighsHashTable<HighsInt> colSet;
  HighsInt m = 0;
  for (HighsInt j = 0; j < numActiveCols; ++j) {
    HighsInt jImagePos = vertexPosition[perm[j]];
    if (jImagePos <= j) continue;
    if (m == orbitopeNumRows) return false;

    // permutation should consist of two cycles
    if (perm[jImagePos] != vertexGroundSet[j]) return false;

    orbitopeMatrix.matrix[m] = vertexGroundSet[j];
    orbitopeMatrix.matrix[orbitopeMatrix.numRows + m] = perm[j];

    // Remember set of variables of the orbtiope matrix. Each variable should
    // occur only once, otherwise the permutation do not work out. Since we

    if (!colSet.insert(vertexGroundSet[j])) return false;
    if (!colSet.insert(perm[j])) return false;
    ++m;
  }

  // printf("set up first two columns of possible orbitope with permutation
  // %d\n",
  //        p0);

  HighsInt numColsAdded = 2;
  bool triedLeftExtension = false;

  while (numColsAdded < orbitopeMatrix.rowLength) {
    if (colSet.size() != numColsAdded * orbitopeMatrix.numRows) return false;

    HighsInt* thisCol = &orbitopeMatrix(0, numColsAdded);
    HighsInt* prevCol = &orbitopeMatrix(0, numColsAdded - 1);

    bool foundCand = false;

    while (true) {
      HighsInt movePos = vertexPosition[prevCol[0]];
      perm = nullptr;

      for (HighsInt k = componentData.permComponentStarts[component] + 1;
           k < componentData.permComponentStarts[component + 1]; ++k) {
        HighsInt p = componentData.permComponents[k];
        perm = symmetries.permutations.data() + p * numActiveCols;

        if (perm[movePos] != vertexGroundSet[movePos] &&
            !colSet.find(perm[movePos])) {
          foundCand = true;
          break;
        }
      }

      if (!foundCand && !triedLeftExtension) {
        // if we fail to find a permutation extending the last column directly
        // after we set up the first two columns we might try to extend column
        // zero instead of the previous one
        prevCol = &orbitopeMatrix(0, 0);
        triedLeftExtension = true;
        continue;
      }

      break;
    }

    if (!foundCand) {
      // printf("did not find next permutation moving col %d\n", prevCol[0]);
      return false;
    }

    for (HighsInt j = 0; j < orbitopeMatrix.numRows; ++j) {
      HighsInt nextVertex = perm[vertexPosition[prevCol[j]]];

      thisCol[j] = nextVertex;

      // check if this is a two cycle
      if (perm[vertexPosition[nextVertex]] != prevCol[j]) return false;

      if (!colSet.insert(thisCol[j])) {
        // printf("col already exists\n");
        return false;
      }
    }

    ++numColsAdded;
  }

  if (colSet.size() != componentSize) {
    // printf("not all columns of component are mapped\n");
    return false;
  }

  for (HighsInt col : orbitopeMatrix.matrix)
    symmetries.columnToOrbitope.insert(col, symmetries.orbitopes.size());

  symmetries.orbitopes.emplace_back(std::move(orbitopeMatrix));

  // printf("component %d is full orbitope: size %d and %d orbits\n", component,
  //        componentSize, componentData.componentNumOrbits[component]);
  return true;
}